

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O1

void lookup_entry_points(MOJOSHADER_glGetProcAddress lookup,void *d)

{
  MOJOSHADER_glContext *pMVar1;
  PFNGLGETSTRINGPROC p_Var2;
  PFNGLGETERRORPROC p_Var3;
  PFNGLGETINTEGERVPROC p_Var4;
  PFNGLENABLEPROC p_Var5;
  PFNGLDISABLEPROC p_Var6;
  PFNGLGETSTRINGIPROC p_Var7;
  PFNGLDELETESHADERPROC p_Var8;
  PFNGLDELETEPROGRAMPROC p_Var9;
  PFNGLATTACHSHADERPROC p_Var10;
  PFNGLCOMPILESHADERPROC p_Var11;
  PFNGLCREATESHADERPROC p_Var12;
  PFNGLCREATEPROGRAMPROC p_Var13;
  PFNGLDISABLEVERTEXATTRIBARRAYPROC p_Var14;
  PFNGLENABLEVERTEXATTRIBARRAYPROC p_Var15;
  PFNGLGETATTRIBLOCATIONPROC p_Var16;
  PFNGLGETPROGRAMINFOLOGPROC p_Var17;
  PFNGLGETSHADERINFOLOGPROC p_Var18;
  PFNGLGETSHADERIVPROC p_Var19;
  PFNGLGETPROGRAMIVPROC p_Var20;
  PFNGLGETUNIFORMLOCATIONPROC p_Var21;
  PFNGLLINKPROGRAMPROC p_Var22;
  PFNGLSHADERSOURCEPROC p_Var23;
  PFNGLUNIFORM1IPROC p_Var24;
  PFNGLUNIFORM1IVPROC p_Var25;
  PFNGLUNIFORM4FVPROC p_Var26;
  PFNGLUNIFORM4IVPROC p_Var27;
  PFNGLUSEPROGRAMPROC p_Var28;
  PFNGLVERTEXATTRIBPOINTERPROC p_Var29;
  PFNGLDELETEOBJECTARBPROC p_Var30;
  PFNGLATTACHOBJECTARBPROC p_Var31;
  PFNGLCOMPILESHADERARBPROC p_Var32;
  PFNGLCREATEPROGRAMOBJECTARBPROC p_Var33;
  PFNGLCREATESHADEROBJECTARBPROC p_Var34;
  PFNGLGETINFOLOGARBPROC p_Var35;
  PFNGLGETOBJECTPARAMETERIVARBPROC p_Var36;
  PFNGLGETUNIFORMLOCATIONARBPROC p_Var37;
  PFNGLLINKPROGRAMARBPROC p_Var38;
  PFNGLSHADERSOURCEARBPROC p_Var39;
  PFNGLUNIFORM1IARBPROC p_Var40;
  PFNGLUNIFORM1IVARBPROC p_Var41;
  PFNGLUNIFORM4FVARBPROC p_Var42;
  PFNGLUNIFORM4IVARBPROC p_Var43;
  PFNGLUSEPROGRAMOBJECTARBPROC p_Var44;
  PFNGLDISABLEVERTEXATTRIBARRAYARBPROC p_Var45;
  PFNGLENABLEVERTEXATTRIBARRAYARBPROC p_Var46;
  PFNGLGETATTRIBLOCATIONARBPROC p_Var47;
  PFNGLVERTEXATTRIBPOINTERARBPROC p_Var48;
  PFNGLGETPROGRAMIVARBPROC p_Var49;
  PFNGLPROGRAMLOCALPARAMETER4FVARBPROC p_Var50;
  PFNGLDELETEPROGRAMSARBPROC p_Var51;
  PFNGLGENPROGRAMSARBPROC p_Var52;
  PFNGLBINDPROGRAMARBPROC p_Var53;
  PFNGLPROGRAMSTRINGARBPROC p_Var54;
  PFNGLPROGRAMLOCALPARAMETERI4IVNVPROC p_Var55;
  PFNGLVERTEXATTRIBDIVISORARBPROC p_Var56;
  
  pMVar1 = ctx;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var2 = (PFNGLGETSTRINGPROC)0x0;
  }
  else {
    p_Var2 = (PFNGLGETSTRINGPROC)(*lookup)("glGetString",d);
  }
  if (p_Var2 == (PFNGLGETSTRINGPROC)0x0) {
    pMVar1->have_core_opengl = 0;
  }
  pMVar1 = ctx;
  ctx->glGetString = p_Var2;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var3 = (PFNGLGETERRORPROC)0x0;
  }
  else {
    p_Var3 = (PFNGLGETERRORPROC)(*lookup)("glGetError",d);
  }
  if (p_Var3 == (PFNGLGETERRORPROC)0x0) {
    pMVar1->have_core_opengl = 0;
  }
  pMVar1 = ctx;
  ctx->glGetError = p_Var3;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var4 = (PFNGLGETINTEGERVPROC)0x0;
  }
  else {
    p_Var4 = (PFNGLGETINTEGERVPROC)(*lookup)("glGetIntegerv",d);
  }
  if (p_Var4 == (PFNGLGETINTEGERVPROC)0x0) {
    pMVar1->have_core_opengl = 0;
  }
  pMVar1 = ctx;
  ctx->glGetIntegerv = p_Var4;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var5 = (PFNGLENABLEPROC)0x0;
  }
  else {
    p_Var5 = (PFNGLENABLEPROC)(*lookup)("glEnable",d);
  }
  if (p_Var5 == (PFNGLENABLEPROC)0x0) {
    pMVar1->have_core_opengl = 0;
  }
  pMVar1 = ctx;
  ctx->glEnable = p_Var5;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var6 = (PFNGLDISABLEPROC)0x0;
  }
  else {
    p_Var6 = (PFNGLDISABLEPROC)(*lookup)("glDisable",d);
  }
  if (p_Var6 == (PFNGLDISABLEPROC)0x0) {
    pMVar1->have_core_opengl = 0;
  }
  pMVar1 = ctx;
  ctx->glDisable = p_Var6;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var7 = (PFNGLGETSTRINGIPROC)0x0;
  }
  else {
    p_Var7 = (PFNGLGETSTRINGIPROC)(*lookup)("glGetStringi",d);
  }
  if (p_Var7 == (PFNGLGETSTRINGIPROC)0x0) {
    pMVar1->have_opengl_3 = 0;
  }
  pMVar1 = ctx;
  ctx->glGetStringi = p_Var7;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var8 = (PFNGLDELETESHADERPROC)0x0;
  }
  else {
    p_Var8 = (PFNGLDELETESHADERPROC)(*lookup)("glDeleteShader",d);
  }
  if (p_Var8 == (PFNGLDELETESHADERPROC)0x0) {
    pMVar1->have_opengl_2 = 0;
  }
  pMVar1 = ctx;
  ctx->glDeleteShader = p_Var8;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var9 = (PFNGLDELETEPROGRAMPROC)0x0;
  }
  else {
    p_Var9 = (PFNGLDELETEPROGRAMPROC)(*lookup)("glDeleteProgram",d);
  }
  if (p_Var9 == (PFNGLDELETEPROGRAMPROC)0x0) {
    pMVar1->have_opengl_2 = 0;
  }
  pMVar1 = ctx;
  ctx->glDeleteProgram = p_Var9;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var10 = (PFNGLATTACHSHADERPROC)0x0;
  }
  else {
    p_Var10 = (PFNGLATTACHSHADERPROC)(*lookup)("glAttachShader",d);
  }
  if (p_Var10 == (PFNGLATTACHSHADERPROC)0x0) {
    pMVar1->have_opengl_2 = 0;
  }
  pMVar1 = ctx;
  ctx->glAttachShader = p_Var10;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var11 = (PFNGLCOMPILESHADERPROC)0x0;
  }
  else {
    p_Var11 = (PFNGLCOMPILESHADERPROC)(*lookup)("glCompileShader",d);
  }
  if (p_Var11 == (PFNGLCOMPILESHADERPROC)0x0) {
    pMVar1->have_opengl_2 = 0;
  }
  pMVar1 = ctx;
  ctx->glCompileShader = p_Var11;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var12 = (PFNGLCREATESHADERPROC)0x0;
  }
  else {
    p_Var12 = (PFNGLCREATESHADERPROC)(*lookup)("glCreateShader",d);
  }
  if (p_Var12 == (PFNGLCREATESHADERPROC)0x0) {
    pMVar1->have_opengl_2 = 0;
  }
  pMVar1 = ctx;
  ctx->glCreateShader = p_Var12;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var13 = (PFNGLCREATEPROGRAMPROC)0x0;
  }
  else {
    p_Var13 = (PFNGLCREATEPROGRAMPROC)(*lookup)("glCreateProgram",d);
  }
  if (p_Var13 == (PFNGLCREATEPROGRAMPROC)0x0) {
    pMVar1->have_opengl_2 = 0;
  }
  pMVar1 = ctx;
  ctx->glCreateProgram = p_Var13;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var14 = (PFNGLDISABLEVERTEXATTRIBARRAYPROC)0x0;
  }
  else {
    p_Var14 = (PFNGLDISABLEVERTEXATTRIBARRAYPROC)(*lookup)("glDisableVertexAttribArray",d);
  }
  if (p_Var14 == (PFNGLDISABLEVERTEXATTRIBARRAYPROC)0x0) {
    pMVar1->have_opengl_2 = 0;
  }
  pMVar1 = ctx;
  ctx->glDisableVertexAttribArray = p_Var14;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var15 = (PFNGLENABLEVERTEXATTRIBARRAYPROC)0x0;
  }
  else {
    p_Var15 = (PFNGLENABLEVERTEXATTRIBARRAYPROC)(*lookup)("glEnableVertexAttribArray",d);
  }
  if (p_Var15 == (PFNGLENABLEVERTEXATTRIBARRAYPROC)0x0) {
    pMVar1->have_opengl_2 = 0;
  }
  pMVar1 = ctx;
  ctx->glEnableVertexAttribArray = p_Var15;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var16 = (PFNGLGETATTRIBLOCATIONPROC)0x0;
  }
  else {
    p_Var16 = (PFNGLGETATTRIBLOCATIONPROC)(*lookup)("glGetAttribLocation",d);
  }
  if (p_Var16 == (PFNGLGETATTRIBLOCATIONPROC)0x0) {
    pMVar1->have_opengl_2 = 0;
  }
  pMVar1 = ctx;
  ctx->glGetAttribLocation = p_Var16;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var17 = (PFNGLGETPROGRAMINFOLOGPROC)0x0;
  }
  else {
    p_Var17 = (PFNGLGETPROGRAMINFOLOGPROC)(*lookup)("glGetProgramInfoLog",d);
  }
  if (p_Var17 == (PFNGLGETPROGRAMINFOLOGPROC)0x0) {
    pMVar1->have_opengl_2 = 0;
  }
  pMVar1 = ctx;
  ctx->glGetProgramInfoLog = p_Var17;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var18 = (PFNGLGETSHADERINFOLOGPROC)0x0;
  }
  else {
    p_Var18 = (PFNGLGETSHADERINFOLOGPROC)(*lookup)("glGetShaderInfoLog",d);
  }
  if (p_Var18 == (PFNGLGETSHADERINFOLOGPROC)0x0) {
    pMVar1->have_opengl_2 = 0;
  }
  pMVar1 = ctx;
  ctx->glGetShaderInfoLog = p_Var18;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var19 = (PFNGLGETSHADERIVPROC)0x0;
  }
  else {
    p_Var19 = (PFNGLGETSHADERIVPROC)(*lookup)("glGetShaderiv",d);
  }
  if (p_Var19 == (PFNGLGETSHADERIVPROC)0x0) {
    pMVar1->have_opengl_2 = 0;
  }
  pMVar1 = ctx;
  ctx->glGetShaderiv = p_Var19;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var20 = (PFNGLGETPROGRAMIVPROC)0x0;
  }
  else {
    p_Var20 = (PFNGLGETPROGRAMIVPROC)(*lookup)("glGetProgramiv",d);
  }
  if (p_Var20 == (PFNGLGETPROGRAMIVPROC)0x0) {
    pMVar1->have_opengl_2 = 0;
  }
  pMVar1 = ctx;
  ctx->glGetProgramiv = p_Var20;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var21 = (PFNGLGETUNIFORMLOCATIONPROC)0x0;
  }
  else {
    p_Var21 = (PFNGLGETUNIFORMLOCATIONPROC)(*lookup)("glGetUniformLocation",d);
  }
  if (p_Var21 == (PFNGLGETUNIFORMLOCATIONPROC)0x0) {
    pMVar1->have_opengl_2 = 0;
  }
  pMVar1 = ctx;
  ctx->glGetUniformLocation = p_Var21;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var22 = (PFNGLLINKPROGRAMPROC)0x0;
  }
  else {
    p_Var22 = (PFNGLLINKPROGRAMPROC)(*lookup)("glLinkProgram",d);
  }
  if (p_Var22 == (PFNGLLINKPROGRAMPROC)0x0) {
    pMVar1->have_opengl_2 = 0;
  }
  pMVar1 = ctx;
  ctx->glLinkProgram = p_Var22;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var23 = (PFNGLSHADERSOURCEPROC)0x0;
  }
  else {
    p_Var23 = (PFNGLSHADERSOURCEPROC)(*lookup)("glShaderSource",d);
  }
  if (p_Var23 == (PFNGLSHADERSOURCEPROC)0x0) {
    pMVar1->have_opengl_2 = 0;
  }
  pMVar1 = ctx;
  ctx->glShaderSource = p_Var23;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var24 = (PFNGLUNIFORM1IPROC)0x0;
  }
  else {
    p_Var24 = (PFNGLUNIFORM1IPROC)(*lookup)("glUniform1i",d);
  }
  if (p_Var24 == (PFNGLUNIFORM1IPROC)0x0) {
    pMVar1->have_opengl_2 = 0;
  }
  pMVar1 = ctx;
  ctx->glUniform1i = p_Var24;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var25 = (PFNGLUNIFORM1IVPROC)0x0;
  }
  else {
    p_Var25 = (PFNGLUNIFORM1IVPROC)(*lookup)("glUniform1iv",d);
  }
  if (p_Var25 == (PFNGLUNIFORM1IVPROC)0x0) {
    pMVar1->have_opengl_2 = 0;
  }
  pMVar1 = ctx;
  ctx->glUniform1iv = p_Var25;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var26 = (PFNGLUNIFORM4FVPROC)0x0;
  }
  else {
    p_Var26 = (PFNGLUNIFORM4FVPROC)(*lookup)("glUniform4fv",d);
  }
  if (p_Var26 == (PFNGLUNIFORM4FVPROC)0x0) {
    pMVar1->have_opengl_2 = 0;
  }
  pMVar1 = ctx;
  ctx->glUniform4fv = p_Var26;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var27 = (PFNGLUNIFORM4IVPROC)0x0;
  }
  else {
    p_Var27 = (PFNGLUNIFORM4IVPROC)(*lookup)("glUniform4iv",d);
  }
  if (p_Var27 == (PFNGLUNIFORM4IVPROC)0x0) {
    pMVar1->have_opengl_2 = 0;
  }
  pMVar1 = ctx;
  ctx->glUniform4iv = p_Var27;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var28 = (PFNGLUSEPROGRAMPROC)0x0;
  }
  else {
    p_Var28 = (PFNGLUSEPROGRAMPROC)(*lookup)("glUseProgram",d);
  }
  if (p_Var28 == (PFNGLUSEPROGRAMPROC)0x0) {
    pMVar1->have_opengl_2 = 0;
  }
  pMVar1 = ctx;
  ctx->glUseProgram = p_Var28;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var29 = (PFNGLVERTEXATTRIBPOINTERPROC)0x0;
  }
  else {
    p_Var29 = (PFNGLVERTEXATTRIBPOINTERPROC)(*lookup)("glVertexAttribPointer",d);
  }
  if (p_Var29 == (PFNGLVERTEXATTRIBPOINTERPROC)0x0) {
    pMVar1->have_opengl_2 = 0;
  }
  pMVar1 = ctx;
  ctx->glVertexAttribPointer = p_Var29;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var30 = (PFNGLDELETEOBJECTARBPROC)0x0;
  }
  else {
    p_Var30 = (PFNGLDELETEOBJECTARBPROC)(*lookup)("glDeleteObjectARB",d);
  }
  if (p_Var30 == (PFNGLDELETEOBJECTARBPROC)0x0) {
    pMVar1->have_GL_ARB_shader_objects = 0;
  }
  pMVar1 = ctx;
  ctx->glDeleteObjectARB = p_Var30;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var31 = (PFNGLATTACHOBJECTARBPROC)0x0;
  }
  else {
    p_Var31 = (PFNGLATTACHOBJECTARBPROC)(*lookup)("glAttachObjectARB",d);
  }
  if (p_Var31 == (PFNGLATTACHOBJECTARBPROC)0x0) {
    pMVar1->have_GL_ARB_shader_objects = 0;
  }
  pMVar1 = ctx;
  ctx->glAttachObjectARB = p_Var31;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var32 = (PFNGLCOMPILESHADERARBPROC)0x0;
  }
  else {
    p_Var32 = (PFNGLCOMPILESHADERARBPROC)(*lookup)("glCompileShaderARB",d);
  }
  if (p_Var32 == (PFNGLCOMPILESHADERARBPROC)0x0) {
    pMVar1->have_GL_ARB_shader_objects = 0;
  }
  pMVar1 = ctx;
  ctx->glCompileShaderARB = p_Var32;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var33 = (PFNGLCREATEPROGRAMOBJECTARBPROC)0x0;
  }
  else {
    p_Var33 = (PFNGLCREATEPROGRAMOBJECTARBPROC)(*lookup)("glCreateProgramObjectARB",d);
  }
  if (p_Var33 == (PFNGLCREATEPROGRAMOBJECTARBPROC)0x0) {
    pMVar1->have_GL_ARB_shader_objects = 0;
  }
  pMVar1 = ctx;
  ctx->glCreateProgramObjectARB = p_Var33;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var34 = (PFNGLCREATESHADEROBJECTARBPROC)0x0;
  }
  else {
    p_Var34 = (PFNGLCREATESHADEROBJECTARBPROC)(*lookup)("glCreateShaderObjectARB",d);
  }
  if (p_Var34 == (PFNGLCREATESHADEROBJECTARBPROC)0x0) {
    pMVar1->have_GL_ARB_shader_objects = 0;
  }
  pMVar1 = ctx;
  ctx->glCreateShaderObjectARB = p_Var34;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var35 = (PFNGLGETINFOLOGARBPROC)0x0;
  }
  else {
    p_Var35 = (PFNGLGETINFOLOGARBPROC)(*lookup)("glGetInfoLogARB",d);
  }
  if (p_Var35 == (PFNGLGETINFOLOGARBPROC)0x0) {
    pMVar1->have_GL_ARB_shader_objects = 0;
  }
  pMVar1 = ctx;
  ctx->glGetInfoLogARB = p_Var35;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var36 = (PFNGLGETOBJECTPARAMETERIVARBPROC)0x0;
  }
  else {
    p_Var36 = (PFNGLGETOBJECTPARAMETERIVARBPROC)(*lookup)("glGetObjectParameterivARB",d);
  }
  if (p_Var36 == (PFNGLGETOBJECTPARAMETERIVARBPROC)0x0) {
    pMVar1->have_GL_ARB_shader_objects = 0;
  }
  pMVar1 = ctx;
  ctx->glGetObjectParameterivARB = p_Var36;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var37 = (PFNGLGETUNIFORMLOCATIONARBPROC)0x0;
  }
  else {
    p_Var37 = (PFNGLGETUNIFORMLOCATIONARBPROC)(*lookup)("glGetUniformLocationARB",d);
  }
  if (p_Var37 == (PFNGLGETUNIFORMLOCATIONARBPROC)0x0) {
    pMVar1->have_GL_ARB_shader_objects = 0;
  }
  pMVar1 = ctx;
  ctx->glGetUniformLocationARB = p_Var37;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var38 = (PFNGLLINKPROGRAMARBPROC)0x0;
  }
  else {
    p_Var38 = (PFNGLLINKPROGRAMARBPROC)(*lookup)("glLinkProgramARB",d);
  }
  if (p_Var38 == (PFNGLLINKPROGRAMARBPROC)0x0) {
    pMVar1->have_GL_ARB_shader_objects = 0;
  }
  pMVar1 = ctx;
  ctx->glLinkProgramARB = p_Var38;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var39 = (PFNGLSHADERSOURCEARBPROC)0x0;
  }
  else {
    p_Var39 = (PFNGLSHADERSOURCEARBPROC)(*lookup)("glShaderSourceARB",d);
  }
  if (p_Var39 == (PFNGLSHADERSOURCEARBPROC)0x0) {
    pMVar1->have_GL_ARB_shader_objects = 0;
  }
  pMVar1 = ctx;
  ctx->glShaderSourceARB = p_Var39;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var40 = (PFNGLUNIFORM1IARBPROC)0x0;
  }
  else {
    p_Var40 = (PFNGLUNIFORM1IARBPROC)(*lookup)("glUniform1iARB",d);
  }
  if (p_Var40 == (PFNGLUNIFORM1IARBPROC)0x0) {
    pMVar1->have_GL_ARB_shader_objects = 0;
  }
  pMVar1 = ctx;
  ctx->glUniform1iARB = p_Var40;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var41 = (PFNGLUNIFORM1IVARBPROC)0x0;
  }
  else {
    p_Var41 = (PFNGLUNIFORM1IVARBPROC)(*lookup)("glUniform1ivARB",d);
  }
  if (p_Var41 == (PFNGLUNIFORM1IVARBPROC)0x0) {
    pMVar1->have_GL_ARB_shader_objects = 0;
  }
  pMVar1 = ctx;
  ctx->glUniform1ivARB = p_Var41;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var42 = (PFNGLUNIFORM4FVARBPROC)0x0;
  }
  else {
    p_Var42 = (PFNGLUNIFORM4FVARBPROC)(*lookup)("glUniform4fvARB",d);
  }
  if (p_Var42 == (PFNGLUNIFORM4FVARBPROC)0x0) {
    pMVar1->have_GL_ARB_shader_objects = 0;
  }
  pMVar1 = ctx;
  ctx->glUniform4fvARB = p_Var42;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var43 = (PFNGLUNIFORM4IVARBPROC)0x0;
  }
  else {
    p_Var43 = (PFNGLUNIFORM4IVARBPROC)(*lookup)("glUniform4ivARB",d);
  }
  if (p_Var43 == (PFNGLUNIFORM4IVARBPROC)0x0) {
    pMVar1->have_GL_ARB_shader_objects = 0;
  }
  pMVar1 = ctx;
  ctx->glUniform4ivARB = p_Var43;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var44 = (PFNGLUSEPROGRAMOBJECTARBPROC)0x0;
  }
  else {
    p_Var44 = (PFNGLUSEPROGRAMOBJECTARBPROC)(*lookup)("glUseProgramObjectARB",d);
  }
  if (p_Var44 == (PFNGLUSEPROGRAMOBJECTARBPROC)0x0) {
    pMVar1->have_GL_ARB_shader_objects = 0;
  }
  pMVar1 = ctx;
  ctx->glUseProgramObjectARB = p_Var44;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var45 = (PFNGLDISABLEVERTEXATTRIBARRAYARBPROC)0x0;
  }
  else {
    p_Var45 = (PFNGLDISABLEVERTEXATTRIBARRAYARBPROC)(*lookup)("glDisableVertexAttribArrayARB",d);
  }
  if (p_Var45 == (PFNGLDISABLEVERTEXATTRIBARRAYARBPROC)0x0) {
    pMVar1->have_GL_ARB_vertex_shader = 0;
  }
  pMVar1 = ctx;
  ctx->glDisableVertexAttribArrayARB = p_Var45;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var46 = (PFNGLENABLEVERTEXATTRIBARRAYARBPROC)0x0;
  }
  else {
    p_Var46 = (PFNGLENABLEVERTEXATTRIBARRAYARBPROC)(*lookup)("glEnableVertexAttribArrayARB",d);
  }
  if (p_Var46 == (PFNGLENABLEVERTEXATTRIBARRAYARBPROC)0x0) {
    pMVar1->have_GL_ARB_vertex_shader = 0;
  }
  pMVar1 = ctx;
  ctx->glEnableVertexAttribArrayARB = p_Var46;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var47 = (PFNGLGETATTRIBLOCATIONARBPROC)0x0;
  }
  else {
    p_Var47 = (PFNGLGETATTRIBLOCATIONARBPROC)(*lookup)("glGetAttribLocationARB",d);
  }
  if (p_Var47 == (PFNGLGETATTRIBLOCATIONARBPROC)0x0) {
    pMVar1->have_GL_ARB_vertex_shader = 0;
  }
  pMVar1 = ctx;
  ctx->glGetAttribLocationARB = p_Var47;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var48 = (PFNGLVERTEXATTRIBPOINTERARBPROC)0x0;
  }
  else {
    p_Var48 = (PFNGLVERTEXATTRIBPOINTERARBPROC)(*lookup)("glVertexAttribPointerARB",d);
  }
  if (p_Var48 == (PFNGLVERTEXATTRIBPOINTERARBPROC)0x0) {
    pMVar1->have_GL_ARB_vertex_shader = 0;
  }
  pMVar1 = ctx;
  ctx->glVertexAttribPointerARB = p_Var48;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var48 = (PFNGLVERTEXATTRIBPOINTERARBPROC)0x0;
  }
  else {
    p_Var48 = (PFNGLVERTEXATTRIBPOINTERARBPROC)(*lookup)("glVertexAttribPointerARB",d);
  }
  if (p_Var48 == (PFNGLVERTEXATTRIBPOINTERARBPROC)0x0) {
    pMVar1->have_GL_ARB_vertex_program = 0;
  }
  pMVar1 = ctx;
  ctx->glVertexAttribPointerARB = p_Var48;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var49 = (PFNGLGETPROGRAMIVARBPROC)0x0;
  }
  else {
    p_Var49 = (PFNGLGETPROGRAMIVARBPROC)(*lookup)("glGetProgramivARB",d);
  }
  if (p_Var49 == (PFNGLGETPROGRAMIVARBPROC)0x0) {
    pMVar1->have_GL_ARB_vertex_program = 0;
  }
  pMVar1 = ctx;
  ctx->glGetProgramivARB = p_Var49;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var50 = (PFNGLPROGRAMLOCALPARAMETER4FVARBPROC)0x0;
  }
  else {
    p_Var50 = (PFNGLPROGRAMLOCALPARAMETER4FVARBPROC)(*lookup)("glProgramLocalParameter4fvARB",d);
  }
  if (p_Var50 == (PFNGLPROGRAMLOCALPARAMETER4FVARBPROC)0x0) {
    pMVar1->have_GL_ARB_vertex_program = 0;
  }
  pMVar1 = ctx;
  ctx->glProgramLocalParameter4fvARB = p_Var50;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var51 = (PFNGLDELETEPROGRAMSARBPROC)0x0;
  }
  else {
    p_Var51 = (PFNGLDELETEPROGRAMSARBPROC)(*lookup)("glDeleteProgramsARB",d);
  }
  if (p_Var51 == (PFNGLDELETEPROGRAMSARBPROC)0x0) {
    pMVar1->have_GL_ARB_vertex_program = 0;
  }
  pMVar1 = ctx;
  ctx->glDeleteProgramsARB = p_Var51;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var52 = (PFNGLGENPROGRAMSARBPROC)0x0;
  }
  else {
    p_Var52 = (PFNGLGENPROGRAMSARBPROC)(*lookup)("glGenProgramsARB",d);
  }
  if (p_Var52 == (PFNGLGENPROGRAMSARBPROC)0x0) {
    pMVar1->have_GL_ARB_vertex_program = 0;
  }
  pMVar1 = ctx;
  ctx->glGenProgramsARB = p_Var52;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var53 = (PFNGLBINDPROGRAMARBPROC)0x0;
  }
  else {
    p_Var53 = (PFNGLBINDPROGRAMARBPROC)(*lookup)("glBindProgramARB",d);
  }
  if (p_Var53 == (PFNGLBINDPROGRAMARBPROC)0x0) {
    pMVar1->have_GL_ARB_vertex_program = 0;
  }
  pMVar1 = ctx;
  ctx->glBindProgramARB = p_Var53;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var54 = (PFNGLPROGRAMSTRINGARBPROC)0x0;
  }
  else {
    p_Var54 = (PFNGLPROGRAMSTRINGARBPROC)(*lookup)("glProgramStringARB",d);
  }
  if (p_Var54 == (PFNGLPROGRAMSTRINGARBPROC)0x0) {
    pMVar1->have_GL_ARB_vertex_program = 0;
  }
  pMVar1 = ctx;
  ctx->glProgramStringARB = p_Var54;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var55 = (PFNGLPROGRAMLOCALPARAMETERI4IVNVPROC)0x0;
  }
  else {
    p_Var55 = (PFNGLPROGRAMLOCALPARAMETERI4IVNVPROC)(*lookup)("glProgramLocalParameterI4ivNV",d);
  }
  if (p_Var55 == (PFNGLPROGRAMLOCALPARAMETERI4IVNVPROC)0x0) {
    pMVar1->have_GL_NV_gpu_program4 = 0;
  }
  pMVar1 = ctx;
  ctx->glProgramLocalParameterI4ivNV = p_Var55;
  if (lookup == (MOJOSHADER_glGetProcAddress)0x0) {
    p_Var56 = (PFNGLVERTEXATTRIBDIVISORARBPROC)0x0;
  }
  else {
    p_Var56 = (PFNGLVERTEXATTRIBDIVISORARBPROC)(*lookup)("glVertexAttribDivisorARB",d);
  }
  if (p_Var56 == (PFNGLVERTEXATTRIBDIVISORARBPROC)0x0) {
    pMVar1->have_GL_ARB_instanced_arrays = 0;
  }
  ctx->glVertexAttribDivisorARB = p_Var56;
  return;
}

Assistant:

static void lookup_entry_points(MOJOSHADER_glGetProcAddress lookup, void *d)
{
    #define DO_LOOKUP(ext, typ, fn) { \
        ctx->fn = (typ) loadsym(lookup, d, #fn, &ctx->have_##ext); \
    }

    DO_LOOKUP(core_opengl, PFNGLGETSTRINGPROC, glGetString);
    DO_LOOKUP(core_opengl, PFNGLGETERRORPROC, glGetError);
    DO_LOOKUP(core_opengl, PFNGLGETINTEGERVPROC, glGetIntegerv);
    DO_LOOKUP(core_opengl, PFNGLENABLEPROC, glEnable);
    DO_LOOKUP(core_opengl, PFNGLDISABLEPROC, glDisable);
    DO_LOOKUP(opengl_3, PFNGLGETSTRINGIPROC, glGetStringi);
    DO_LOOKUP(opengl_2, PFNGLDELETESHADERPROC, glDeleteShader);
    DO_LOOKUP(opengl_2, PFNGLDELETEPROGRAMPROC, glDeleteProgram);
    DO_LOOKUP(opengl_2, PFNGLATTACHSHADERPROC, glAttachShader);
    DO_LOOKUP(opengl_2, PFNGLCOMPILESHADERPROC, glCompileShader);
    DO_LOOKUP(opengl_2, PFNGLCREATESHADERPROC, glCreateShader);
    DO_LOOKUP(opengl_2, PFNGLCREATEPROGRAMPROC, glCreateProgram);
    DO_LOOKUP(opengl_2, PFNGLDISABLEVERTEXATTRIBARRAYPROC, glDisableVertexAttribArray);
    DO_LOOKUP(opengl_2, PFNGLENABLEVERTEXATTRIBARRAYPROC, glEnableVertexAttribArray);
    DO_LOOKUP(opengl_2, PFNGLGETATTRIBLOCATIONPROC, glGetAttribLocation);
    DO_LOOKUP(opengl_2, PFNGLGETPROGRAMINFOLOGPROC, glGetProgramInfoLog);
    DO_LOOKUP(opengl_2, PFNGLGETSHADERINFOLOGPROC, glGetShaderInfoLog);
    DO_LOOKUP(opengl_2, PFNGLGETSHADERIVPROC, glGetShaderiv);
    DO_LOOKUP(opengl_2, PFNGLGETPROGRAMIVPROC, glGetProgramiv);
    DO_LOOKUP(opengl_2, PFNGLGETUNIFORMLOCATIONPROC, glGetUniformLocation);
    DO_LOOKUP(opengl_2, PFNGLLINKPROGRAMPROC, glLinkProgram);
    DO_LOOKUP(opengl_2, PFNGLSHADERSOURCEPROC, glShaderSource);
    DO_LOOKUP(opengl_2, PFNGLUNIFORM1IPROC, glUniform1i);
    DO_LOOKUP(opengl_2, PFNGLUNIFORM1IVPROC, glUniform1iv);
#ifdef MOJOSHADER_FLIP_RENDERTARGET
    DO_LOOKUP(opengl_2, PFNGLUNIFORM1FPROC, glUniform1f);
#endif
    DO_LOOKUP(opengl_2, PFNGLUNIFORM4FVPROC, glUniform4fv);
    DO_LOOKUP(opengl_2, PFNGLUNIFORM4IVPROC, glUniform4iv);
    DO_LOOKUP(opengl_2, PFNGLUSEPROGRAMPROC, glUseProgram);
    DO_LOOKUP(opengl_2, PFNGLVERTEXATTRIBPOINTERPROC, glVertexAttribPointer);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLDELETEOBJECTARBPROC, glDeleteObjectARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLATTACHOBJECTARBPROC, glAttachObjectARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLCOMPILESHADERARBPROC, glCompileShaderARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLCREATEPROGRAMOBJECTARBPROC, glCreateProgramObjectARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLCREATESHADEROBJECTARBPROC, glCreateShaderObjectARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLGETINFOLOGARBPROC, glGetInfoLogARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLGETOBJECTPARAMETERIVARBPROC, glGetObjectParameterivARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLGETUNIFORMLOCATIONARBPROC, glGetUniformLocationARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLLINKPROGRAMARBPROC, glLinkProgramARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLSHADERSOURCEARBPROC, glShaderSourceARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLUNIFORM1IARBPROC, glUniform1iARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLUNIFORM1IVARBPROC, glUniform1ivARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLUNIFORM4FVARBPROC, glUniform4fvARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLUNIFORM4IVARBPROC, glUniform4ivARB);
    DO_LOOKUP(GL_ARB_shader_objects, PFNGLUSEPROGRAMOBJECTARBPROC, glUseProgramObjectARB);
    DO_LOOKUP(GL_ARB_vertex_shader, PFNGLDISABLEVERTEXATTRIBARRAYARBPROC, glDisableVertexAttribArrayARB);
    DO_LOOKUP(GL_ARB_vertex_shader, PFNGLENABLEVERTEXATTRIBARRAYARBPROC, glEnableVertexAttribArrayARB);
    DO_LOOKUP(GL_ARB_vertex_shader, PFNGLGETATTRIBLOCATIONARBPROC, glGetAttribLocationARB);
    DO_LOOKUP(GL_ARB_vertex_shader, PFNGLVERTEXATTRIBPOINTERARBPROC, glVertexAttribPointerARB);
    DO_LOOKUP(GL_ARB_vertex_program, PFNGLVERTEXATTRIBPOINTERARBPROC, glVertexAttribPointerARB);
    DO_LOOKUP(GL_ARB_vertex_program, PFNGLGETPROGRAMIVARBPROC, glGetProgramivARB);
    DO_LOOKUP(GL_ARB_vertex_program, PFNGLPROGRAMLOCALPARAMETER4FVARBPROC, glProgramLocalParameter4fvARB);
    DO_LOOKUP(GL_ARB_vertex_program, PFNGLDELETEPROGRAMSARBPROC, glDeleteProgramsARB);
    DO_LOOKUP(GL_ARB_vertex_program, PFNGLGENPROGRAMSARBPROC, glGenProgramsARB);
    DO_LOOKUP(GL_ARB_vertex_program, PFNGLBINDPROGRAMARBPROC, glBindProgramARB);
    DO_LOOKUP(GL_ARB_vertex_program, PFNGLPROGRAMSTRINGARBPROC, glProgramStringARB);
    DO_LOOKUP(GL_NV_gpu_program4, PFNGLPROGRAMLOCALPARAMETERI4IVNVPROC, glProgramLocalParameterI4ivNV);
    DO_LOOKUP(GL_ARB_instanced_arrays, PFNGLVERTEXATTRIBDIVISORARBPROC, glVertexAttribDivisorARB);

    #undef DO_LOOKUP
}